

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cLayoutBindingTests.cpp
# Opt level: O2

int __thiscall
glcts::ShaderStorageBufferLayoutBindingCase::maxArraySize
          (ShaderStorageBufferLayoutBindingCase *this)

{
  undefined4 uVar1;
  uint in_EAX;
  uint uVar2;
  int iVar3;
  undefined4 extraout_var;
  int units;
  undefined8 uStack_18;
  
  uStack_18 = (ulong)in_EAX;
  uVar2 = (*(this->super_LayoutBindingBaseCase).super_TestCase.super_TestCase.super_TestNode.
            _vptr_TestNode[0x14])();
  if (uVar2 < 3) {
    uVar1 = *(undefined4 *)(&DAT_01736c9c + (ulong)uVar2 * 4);
    iVar3 = (*((this->super_LayoutBindingBaseCase).super_TestCase.m_context)->m_renderCtx->
              _vptr_RenderContext[3])();
    (**(code **)(CONCAT44(extraout_var,iVar3) + 0x868))(uVar1,(long)&uStack_18 + 4);
  }
  return uStack_18._4_4_;
}

Assistant:

int maxArraySize()
	{
		int units = 0;
		switch (getStage())
		{
		case FragmentShader:
			gl().getIntegerv(GL_MAX_FRAGMENT_SHADER_STORAGE_BLOCKS, &units);
			break;
		case VertexShader:
			gl().getIntegerv(GL_MAX_VERTEX_SHADER_STORAGE_BLOCKS, &units);
			break;
		case ComputeShader:
			gl().getIntegerv(GL_MAX_COMPUTE_SHADER_STORAGE_BLOCKS, &units);
			break;
		default:
			DE_ASSERT(0);
			break;
		}
		return units;
	}